

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcZone::~IfcZone(IfcZone *this)

{
  _func_int **pp_Var1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].super_IfcGroup.super_IfcObject.field_0x38 = 0x86c028;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x20 = 0x86c0a0;
  *(undefined8 *)&this[-1].super_IfcGroup.super_IfcObject.field_0xc0 = 0x86c050;
  *(undefined8 *)&this[-1].super_IfcGroup.super_IfcObject.field_0xd0 = 0x86c078;
  puVar3 = *(undefined1 **)&this[-1].super_IfcGroup.super_IfcObject.field_0xe0;
  puVar2 = &this[-1].super_IfcGroup.field_0xf0;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcGroup.super_IfcObject.field_0x38 = 0x86c140;
  *(undefined8 *)&(this->super_IfcGroup).super_IfcObject.field_0x20 = 0x86c168;
  pp_Var1 = this[-1].super_IfcGroup.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper;
  puVar2 = &this[-1].super_IfcGroup.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  if (pp_Var1 != (_func_int **)puVar2) {
    operator_delete(pp_Var1,*(long *)puVar2 + 1);
  }
  puVar3 = *(undefined1 **)&this[-1].super_IfcGroup.super_IfcObject.field_0x70;
  puVar2 = &this[-1].super_IfcGroup.super_IfcObject.field_0x80;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcGroup.super_IfcObject.field_0x48;
  puVar3 = &this[-1].super_IfcGroup.super_IfcObject.field_0x58;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcGroup.super_IfcObject.field_0x38,0x108);
  return;
}

Assistant:

IfcZone() : Object("IfcZone") {}